

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  DumpState local_40;
  
  local_40.L = L;
  local_40.writer = w;
  local_40.data = data;
  local_40.strip = strip;
  local_40.status = (*w)(L,"\x1bLua",4,data);
  DumpByte(0x53,&local_40);
  DumpByte(0,&local_40);
  if (local_40.status == 0) {
    local_40.status = (*local_40.writer)(local_40.L,anon_var_dwarf_b5a9,6,local_40.data);
  }
  DumpByte(4,&local_40);
  DumpByte(8,&local_40);
  DumpByte(4,&local_40);
  DumpByte(8,&local_40);
  DumpByte(8,&local_40);
  DumpInteger(0x5678,&local_40);
  DumpNumber(370.5,&local_40);
  DumpByte(f->sizeupvalues,&local_40);
  DumpFunction(f,(TString *)0x0,&local_40);
  return local_40.status;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
  DumpState D;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f, NULL);
  return D.status;
}